

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O2

int parse_matrix_parameters(char **begin,char *end,float *values,int required,int optional)

{
  char *pcVar1;
  ulong uVar2;
  _Bool _Var3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  _Bool has_trailing_comma;
  char *it;
  _Bool local_41;
  ulong local_40;
  char *local_38;
  
  local_38 = *begin;
  _Var3 = plutovg_skip_ws(&local_38,end);
  if (((_Var3) && (local_38 < end)) && (*local_38 == '(')) {
    local_38 = local_38 + 1;
    plutovg_skip_ws(&local_38,end);
    *begin = local_38;
    uVar4 = 0;
    if (local_38 < end) {
      uVar10 = optional + required;
      uVar11 = 0;
      local_40 = 0;
      if (0 < (int)uVar10) {
        local_40 = (ulong)uVar10;
      }
      local_41 = false;
      for (; uVar2 = local_40, uVar11 != local_40; uVar11 = uVar11 + 1) {
        pbVar5 = (byte *)*begin;
        if (pbVar5 < end) {
          if (*pbVar5 != 0x2d) {
            if (*pbVar5 == 0x2b) {
              pbVar5 = pbVar5 + 1;
            }
            goto LAB_00106d5f;
          }
          pbVar5 = pbVar5 + 1;
          fVar12 = -1.0;
        }
        else {
LAB_00106d5f:
          fVar12 = 1.0;
        }
        uVar2 = uVar11;
        if (end <= pbVar5) break;
        bVar7 = *pbVar5;
        fVar15 = 0.0;
        if (bVar7 == 0x2e) {
          fVar14 = 0.0;
          pbVar6 = pbVar5;
        }
        else {
          if (9 < (byte)(bVar7 - 0x30)) break;
          fVar14 = 0.0;
          do {
            pbVar5 = pbVar5 + 1;
            fVar14 = fVar14 * 10.0 + (float)(int)(bVar7 - 0x30);
            pbVar6 = (byte *)end;
            if (end <= pbVar5) break;
            bVar7 = *pbVar5;
            pbVar6 = pbVar5;
          } while ((byte)(bVar7 - 0x30) < 10);
        }
        if ((pbVar6 < end) && (*pbVar6 == 0x2e)) {
          if ((end <= pbVar6 + 1) || (bVar7 = pbVar6[1], 9 < (byte)(bVar7 - 0x30))) break;
          fVar15 = 0.0;
          fVar13 = 1.0;
          pbVar5 = pbVar6 + 2;
          do {
            fVar15 = fVar15 * 10.0 + (float)(int)(bVar7 - 0x30);
            fVar13 = fVar13 * 10.0;
            pbVar6 = (byte *)end;
            if (end <= pbVar5) break;
            bVar7 = *pbVar5;
            pbVar6 = pbVar5;
            pbVar5 = pbVar5 + 1;
          } while ((byte)(bVar7 - 0x30) < 10);
          fVar15 = fVar15 / fVar13;
        }
        fVar13 = 0.0;
        if ((pbVar6 < end) && ((*pbVar6 | 0x20) == 0x65)) {
          pbVar5 = pbVar6 + 1;
          pbVar8 = pbVar5;
          if (pbVar5 < end) {
            bVar7 = *pbVar5;
            pbVar8 = pbVar6 + 2;
            if (bVar7 == 0x2b) goto LAB_00106e6d;
            pbVar8 = pbVar5;
            if (bVar7 == 0x2d) {
              pbVar8 = pbVar6 + 2;
            }
            fVar16 = *(float *)(&DAT_0011d7cc + (ulong)(bVar7 == 0x2d) * 4);
          }
          else {
LAB_00106e6d:
            fVar16 = 1.0;
          }
          if ((end <= pbVar8) || (bVar7 = *pbVar8, 9 < (byte)(bVar7 - 0x30))) break;
          do {
            pbVar8 = pbVar8 + 1;
            fVar13 = fVar13 * 10.0 + (float)(int)(bVar7 - 0x30);
            pbVar6 = (byte *)end;
            if (end <= pbVar8) break;
            bVar7 = *pbVar8;
            pbVar6 = pbVar8;
          } while ((byte)(bVar7 - 0x30) < 10);
        }
        else {
          fVar16 = 1.0;
        }
        *begin = (char *)pbVar6;
        fVar12 = fVar12 * (fVar14 + fVar15);
        values[uVar11] = fVar12;
        if ((fVar13 != 0.0) || (NAN(fVar13))) {
          fVar12 = powf(10.0,fVar13 * fVar16);
          fVar12 = fVar12 * values[uVar11];
          values[uVar11] = fVar12;
        }
        if (3.4028235e+38 < ABS(fVar12)) break;
        plutovg_skip_ws_or_comma(begin,end,&local_41);
      }
      local_40 = uVar2;
      uVar4 = 0;
      if ((((local_41 == false) && (uVar9 = (uint)local_40, uVar9 == required || uVar9 == uVar10))
          && (pcVar1 = *begin, pcVar1 < end)) && (*pcVar1 == ')')) {
        *begin = pcVar1 + 1;
        uVar4 = uVar9;
      }
    }
  }
  else {
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

static int parse_matrix_parameters(const char** begin, const char* end, float values[6], int required, int optional)
{
    if(!plutovg_skip_ws_and_delim(begin, end, '('))
        return 0;
    int count = 0;
    int max_count = required + optional;
    bool has_trailing_comma = false;
    for(; count < max_count; ++count) {
        if(!plutovg_parse_number(begin, end, values + count))
            break;
        plutovg_skip_ws_or_comma(begin, end, &has_trailing_comma);
    }

    if(!has_trailing_comma && (count == required || count == max_count)
        && plutovg_skip_delim(begin, end, ')')) {
        return count;
    }

    return 0;
}